

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

int32_t ra_advance_until_freeing(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  int in_EDX;
  ushort in_SI;
  int *in_RDI;
  bool type;
  undefined2 in_stack_fffffffffffffff4;
  
  while( true ) {
    type = false;
    if (in_EDX < *in_RDI) {
      type = *(ushort *)(*(long *)(in_RDI + 4) + (long)in_EDX * 2) < in_SI;
    }
    if (type == false) break;
    container_free((container_t *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,in_EDX)),type);
    in_EDX = in_EDX + 1;
  }
  return in_EDX;
}

Assistant:

int32_t ra_advance_until_freeing(roaring_array_t *ra, uint16_t x, int32_t pos) {
    while (pos < ra->size && ra->keys[pos] < x) {
        container_free(ra->containers[pos], ra->typecodes[pos]);
        ++pos;
    }
    return pos;
}